

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall Json::StyledWriter::writeCommentBeforeValue(StyledWriter *this,Value *root)

{
  bool bVar1;
  reference pcVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  const_iterator iter;
  string local_58;
  undefined1 local_38 [8];
  string normalizedComment;
  Value *root_local;
  StyledWriter *this_local;
  
  normalizedComment.field_2._8_8_ = root;
  bVar1 = Value::hasComment(root,commentBefore);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)&this->document_,"\n");
    writeIndent(this);
    Value::getComment_abi_cxx11_(&local_58,(Value *)normalizedComment.field_2._8_8_,commentBefore);
    normalizeEOL((string *)local_38,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    local_78._M_current = (char *)std::__cxx11::string::begin();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_70,&local_78);
    while( true ) {
      local_80._M_current = (char *)std::__cxx11::string::end();
      bVar1 = __gnu_cxx::operator!=(&local_70,&local_80);
      if (!bVar1) break;
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_70);
      std::__cxx11::string::operator+=((string *)&this->document_,*pcVar2);
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_70);
      bVar1 = false;
      if (*pcVar2 == '\n') {
        local_88 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator+(&local_70,1);
        pcVar2 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_88);
        bVar1 = *pcVar2 == '/';
      }
      if (bVar1) {
        writeIndent(this);
      }
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_70);
    }
    std::__cxx11::string::operator+=((string *)&this->document_,"\n");
    std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

void StyledWriter::writeCommentBeforeValue(const Value& root) {
  if (!root.hasComment(commentBefore))
    return;

  document_ += "\n";
  writeIndent();
  std::string normalizedComment = normalizeEOL(root.getComment(commentBefore));
  std::string::const_iterator iter = normalizedComment.begin();
  while (iter != normalizedComment.end()) {
    document_ += *iter;
    if (*iter == '\n' && *(iter + 1) == '/')
      writeIndent();
    ++iter;
  }

  // Comments are stripped of newlines, so add one here
  document_ += "\n";
}